

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t gc_onestep(lua_State *L)

{
  GCRef *p;
  lua_State *L_00;
  GCRef *pGVar1;
  ulong uVar2;
  global_State *in_RDI;
  MSize unaff_retaddr;
  GCSize old_1;
  GCSize old;
  global_State *g;
  global_State *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t uVar3;
  uint32_t in_stack_ffffffffffffffe4;
  size_t local_8;
  
  p = (GCRef *)(ulong)in_RDI->strmask;
  uVar2 = (ulong)*(byte *)((long)&p[0x16].gcptr32 + 1);
  *(long *)(p + uVar2 * 2 + 0x28) = *(long *)(p + uVar2 * 2 + 0x28) + 1;
  L_00 = (lua_State *)(ulong)*(byte *)((long)&p[0x16].gcptr32 + 1);
  switch(L_00) {
  case (lua_State *)0x0:
    gc_mark_start((global_State *)0x118617);
    local_8 = 0;
    break;
  case (lua_State *)0x1:
    if (p[0x1a].gcptr32 == 0) {
      *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 2;
      local_8 = 0;
    }
    else {
      local_8 = propagatemark(in_stack_00000028);
    }
    break;
  case (lua_State *)0x2:
    if (p[100].gcptr32 == 0) {
      atomic((global_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),L_00);
      *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 3;
      p[0x17].gcptr32 = 0;
      *(undefined8 *)(p + 8) = 0;
      *(undefined8 *)(p + 10) = 0;
      local_8 = 0;
    }
    else {
      local_8 = 0x7fffff00;
    }
    break;
  case (lua_State *)0x3:
    uVar3 = p[0x14].gcptr32;
    p[0x17].gcptr32 = p[0x17].gcptr32 + 1;
    gc_sweep_str_chain(in_RDI,p);
    if (p[2].gcptr32 < p[0x17].gcptr32) {
      *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 4;
      *(undefined8 *)(p + 4) = *(undefined8 *)(p + 8);
      *(undefined8 *)(p + 6) = *(undefined8 *)(p + 10);
    }
    p[0x1f].gcptr32 = p[0x1f].gcptr32 - (uVar3 - p[0x14].gcptr32);
    local_8 = 10;
    break;
  case (lua_State *)0x4:
    uVar3 = p[0x14].gcptr32;
    pGVar1 = gc_sweep(in_RDI,p,in_stack_ffffffffffffffe4);
    p[0x19].gcptr32 = (uint32_t)pGVar1;
    p[0x1f].gcptr32 = p[0x1f].gcptr32 - (uVar3 - p[0x14].gcptr32);
    if (*(int *)(ulong)p[0x19].gcptr32 == 0) {
      if ((p[3].gcptr32 <= p[2].gcptr32 >> 2) && (0x1ff < p[2].gcptr32)) {
        lj_str_resize(_old_1,unaff_retaddr);
      }
      if (p[0x1d].gcptr32 == 0) {
        *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 0;
        p[0x1e].gcptr32 = 0;
      }
      else {
        *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 5;
        *(undefined1 *)((long)&p[0x16].gcptr32 + 2) = 1;
      }
    }
    local_8 = 400;
    break;
  case (lua_State *)0x5:
    if (p[0x1d].gcptr32 == 0) {
      if (*(char *)((long)&p[0x16].gcptr32 + 2) == '\0') {
        lj_tab_rehash((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (GCtab *)L_00);
      }
      *(undefined1 *)((long)&p[0x16].gcptr32 + 1) = 0;
      p[0x1e].gcptr32 = 0;
      local_8 = 0;
    }
    else if (p[100].gcptr32 == 0) {
      gc_finalize(_old_1);
      if (100 < p[0x1f].gcptr32) {
        p[0x1f].gcptr32 = p[0x1f].gcptr32 - 100;
      }
      local_8 = 100;
    }
    else {
      local_8 = 0x7fffff00;
    }
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  g->gc.state_count[g->gc.state]++;
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
#if LUAJIT_SMART_STRINGS
    g->strbloom.next[0] = 0;
    g->strbloom.next[1] = 0;
#endif
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweep_str_chain(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask) {
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
#if LUAJIT_SMART_STRINGS
      g->strbloom.cur[0] = g->strbloom.next[0];
      g->strbloom.cur[1] = g->strbloom.next[1];
#endif
    }
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->strnum <= (g->strmask >> 2) && g->strmask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->strmask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, tabref(g->gcroot[GCROOT_FFI_FIN]));
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}